

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O1

bool absl::debugging_internal::ParseSubstitution(State *state,bool accept_std)

{
  char *pcVar1;
  ParseState *pPVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined8 uVar8;
  bool bVar9;
  char *pcVar10;
  ComplexityGuard guard;
  char *pcVar11;
  long *plVar12;
  ParseState copy;
  
  iVar4 = state->recursion_depth;
  iVar5 = state->steps;
  state->recursion_depth = iVar4 + 1;
  state->steps = iVar5 + 1;
  if (iVar5 < 0x20000 && iVar4 < 0x100) {
    bVar9 = ParseTwoCharToken(state,"S_");
    if (bVar9) {
LAB_00151c40:
      MaybeAppend(state,"?");
LAB_00151c4f:
      bVar9 = true;
      goto LAB_00151d62;
    }
    uVar6 = (state->parse_state).mangled_idx;
    uVar7 = (state->parse_state).out_cur_idx;
    uVar8 = *(undefined8 *)&(state->parse_state).prev_name_idx;
    bVar9 = ParseOneCharToken(state,'S');
    if (bVar9) {
      iVar4 = state->recursion_depth;
      iVar5 = state->steps;
      state->recursion_depth = iVar4 + 1;
      state->steps = iVar5 + 1;
      if (iVar5 < 0x20000 && iVar4 < 0x100) {
        iVar5 = (state->parse_state).mangled_idx;
        pcVar10 = state->mangled_begin + iVar5;
        cVar3 = state->mangled_begin[iVar5];
        pcVar11 = pcVar10;
        while ((cVar3 != '\0' && ((byte)(cVar3 - 0x30U) < 10 || (byte)(cVar3 + 0xbfU) < 0x1a))) {
          pcVar1 = pcVar11 + 1;
          pcVar11 = pcVar11 + 1;
          cVar3 = *pcVar1;
        }
        if (pcVar11 != pcVar10) {
          (state->parse_state).mangled_idx = ((int)pcVar11 - (int)pcVar10) + iVar5;
          state->recursion_depth = iVar4;
          bVar9 = ParseOneCharToken(state,'_');
          if (bVar9) goto LAB_00151c40;
          goto LAB_00151d05;
        }
      }
      state->recursion_depth = iVar4;
    }
LAB_00151d05:
    pPVar2 = &state->parse_state;
    pPVar2->mangled_idx = uVar6;
    pPVar2->out_cur_idx = uVar7;
    *(undefined8 *)&(state->parse_state).prev_name_idx = uVar8;
    bVar9 = ParseOneCharToken(state,'S');
    if (bVar9) {
      pcVar11 = "St";
      plVar12 = (long *)(kSubstitutionList + 0x18);
      do {
        if ((state->mangled_begin[(state->parse_state).mangled_idx] == pcVar11[1]) &&
           (pcVar11[1] != 't' || accept_std)) {
          MaybeAppend(state,"std");
          pcVar11 = (char *)plVar12[-2];
          if (*pcVar11 != '\0') {
            MaybeAppend(state,"::");
            MaybeAppend(state,pcVar11);
          }
          pPVar2->mangled_idx = pPVar2->mangled_idx + 1;
          goto LAB_00151c4f;
        }
        pcVar11 = (char *)*plVar12;
        plVar12 = plVar12 + 3;
      } while (pcVar11 != (char *)0x0);
    }
    pPVar2->mangled_idx = uVar6;
    pPVar2->out_cur_idx = uVar7;
    *(undefined8 *)&(state->parse_state).prev_name_idx = uVar8;
  }
  bVar9 = false;
LAB_00151d62:
  state->recursion_depth = state->recursion_depth + -1;
  return bVar9;
}

Assistant:

static bool ParseSubstitution(State *state, bool accept_std) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;
  if (ParseTwoCharToken(state, "S_")) {
    MaybeAppend(state, "?");  // We don't support substitutions.
    return true;
  }

  ParseState copy = state->parse_state;
  if (ParseOneCharToken(state, 'S') && ParseSeqId(state) &&
      ParseOneCharToken(state, '_')) {
    MaybeAppend(state, "?");  // We don't support substitutions.
    return true;
  }
  state->parse_state = copy;

  // Expand abbreviations like "St" => "std".
  if (ParseOneCharToken(state, 'S')) {
    const AbbrevPair *p;
    for (p = kSubstitutionList; p->abbrev != nullptr; ++p) {
      if (RemainingInput(state)[0] == p->abbrev[1] &&
          (accept_std || p->abbrev[1] != 't')) {
        MaybeAppend(state, "std");
        if (p->real_name[0] != '\0') {
          MaybeAppend(state, "::");
          MaybeAppend(state, p->real_name);
        }
        ++state->parse_state.mangled_idx;
        return true;
      }
    }
  }
  state->parse_state = copy;
  return false;
}